

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O2

__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
 __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>::
find(DualStringMappedVector<helics::BasicFedInfo,_helics::GlobalFederateId,_(reference_stability)1,_5>
     *this,string_view searchValue)

{
  iterator iVar1;
  __normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
  _Var2;
  key_type local_18;
  
  local_18._M_str = searchValue._M_str;
  local_18._M_len = searchValue._M_len;
  iVar1 = std::
          _Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)&this->lookup1,&local_18);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
      ._M_cur == (__node_type *)0x0) {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
         super__Vector_impl_data._M_finish;
  }
  else {
    _Var2._M_current =
         (this->dataStorage).
         super__Vector_base<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>._M_impl.
         super__Vector_impl_data._M_start +
         *(long *)((long)iVar1.
                         super__Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                         ._M_cur + 0x18);
  }
  return (__normal_iterator<helics::BasicFedInfo_*,_std::vector<helics::BasicFedInfo,_std::allocator<helics::BasicFedInfo>_>_>
          )_Var2._M_current;
}

Assistant:

auto find(std::string_view searchValue)
        {
            auto fnd = lookup1.find(searchValue);
            if (fnd != lookup1.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }